

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_round2.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b7780::checkn<unsigned_long,_15U>::operator()(checkn<unsigned_long,_15U> *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_c8;
  uint local_c0 [2];
  Message local_b8;
  unsigned_long local_b0;
  uint64_t local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  uint local_88 [2];
  Message local_80;
  uint64_t local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  uint local_54 [5];
  Message local_40;
  uint64_t local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  unsigned_long v;
  checkn<unsigned_long,_15U> *local_10;
  checkn<unsigned_long,_15U> *this_local;
  
  local_10 = this;
  checkn<unsigned_long,_14U>::operator()((checkn<unsigned_long,_14U> *)((long)&v + 7));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x8000;
  local_38 = pstore::round_to_power_of_2(0x7fff);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_30,"pstore::round_to_power_of_2 (T{v - 1})","v",&local_38,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pMVar2 = testing::Message::operator<<(&local_40,(char (*) [5])"(1<<");
    local_54[1] = 0xf;
    pMVar2 = testing::Message::operator<<(pMVar2,local_54 + 1);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [22])")-1 should become 1<<");
    local_54[0] = 0xf;
    pMVar2 = testing::Message::operator<<(pMVar2,local_54);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_78 = pstore::round_to_power_of_2(0x8000);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_70,"pstore::round_to_power_of_2 (T{v + 0})","v",&local_78,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pMVar2 = testing::Message::operator<<(&local_80,(char (*) [5])"(1<<");
    local_88[1] = 0xf;
    pMVar2 = testing::Message::operator<<(pMVar2,local_88 + 1);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [20])") should become 1<<");
    local_88[0] = 0xf;
    pMVar2 = testing::Message::operator<<(pMVar2,local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_a8 = pstore::round_to_power_of_2(0x8001);
  local_b0 = 0x10000;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_a0,"pstore::round_to_power_of_2 (T{v + 1})","T{1} << (Shift + 1)",
             &local_a8,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pMVar2 = testing::Message::operator<<(&local_b8,(char (*) [5])"(1<<");
    local_c0[1] = 0xf;
    pMVar2 = testing::Message::operator<<(pMVar2,local_c0 + 1);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [22])")+1 should become 1<<");
    local_c0[0] = 0x10;
    pMVar2 = testing::Message::operator<<(pMVar2,local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

void operator() () const {
            checkn<T, Shift - 1U>{}();

            constexpr auto v = T{1} << Shift;
            EXPECT_EQ (pstore::round_to_power_of_2 (T{v - 1}), v)
                << "(1<<" << Shift << ")-1 should become 1<<" << Shift;
            EXPECT_EQ (pstore::round_to_power_of_2 (T{v + 0}), v)
                << "(1<<" << Shift << ") should become 1<<" << Shift;
            EXPECT_EQ (pstore::round_to_power_of_2 (T{v + 1}), T{1} << (Shift + 1))
                << "(1<<" << Shift << ")+1 should become 1<<" << (Shift + 1);
        }